

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall
CTcTokenizer::add_define(CTcTokenizer *this,char *sym,size_t len,char *expansion,size_t expan_len)

{
  void *pvVar1;
  size_t in_RCX;
  textchar_t *in_RDX;
  CTcHashEntryPpDefine *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int unaff_retaddr;
  char **in_stack_00000008;
  size_t *in_stack_00000010;
  char *in_stack_00000018;
  size_t in_stack_00000020;
  CTcHashEntryPp *entry;
  undefined8 in_stack_ffffffffffffffd0;
  int argc;
  
  argc = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  pvVar1 = operator_new(0x68);
  CTcHashEntryPpDefine::CTcHashEntryPpDefine
            (in_RSI,in_RDX,in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,argc,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  (**(code **)(**(long **)(in_RDI + 0xd30) + 0x10))(*(long **)(in_RDI + 0xd30),pvVar1);
  return;
}

Assistant:

void CTcTokenizer::add_define(const char *sym, size_t len,
                              const char *expansion, size_t expan_len)
{
    CTcHashEntryPp *entry;
    
    /* create an entry for the macro, with no argument list */
    entry = new CTcHashEntryPpDefine(sym, len, TRUE, FALSE, 0, FALSE, 0, 0,
                                     expansion, expan_len);

    /* add the new entry to the table */
    defines_->add(entry);
}